

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O0

void __thiscall
ScriptElement_ByteTypeConstructor_Test::TestBody(ScriptElement_ByteTypeConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ScriptOperator *rhs;
  char *pcVar3;
  string local_3a0;
  AssertHelper local_380;
  Message local_378;
  bool local_369;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_338;
  Message local_330;
  bool local_321;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2f0;
  Message local_2e8;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_;
  Message local_2c0;
  string local_2b8;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_5;
  Message local_280;
  ByteData local_278;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_260;
  allocator local_241;
  string local_240;
  ByteData local_220;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_4;
  Message local_1d8;
  int64_t local_1d0;
  undefined4 local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_3;
  Message local_1a8;
  ByteData local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  allocator local_169;
  string local_168;
  ByteData local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_e0;
  ScriptElementType local_d8 [2];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  allocator local_a9;
  string local_a8;
  ByteData local_88;
  undefined1 local_70 [8];
  ScriptElement byte_elem;
  ScriptElement_ByteTypeConstructor_Test *this_local;
  
  byte_elem.value_ = (int64_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"1234567890abcdef",&local_a9);
  cfd::core::ByteData::ByteData(&local_88,&local_a8);
  cfd::core::ScriptElement::ScriptElement((ScriptElement *)local_70,&local_88);
  cfd::core::ByteData::~ByteData(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  local_d8[1] = 1;
  local_d8[0] = cfd::core::ScriptElement::GetType((ScriptElement *)local_70);
  testing::internal::EqHelper<false>::
  Compare<cfd::core::ScriptElementType,cfd::core::ScriptElementType>
            ((EqHelper<false> *)local_d0,"ScriptElementType::kElementBinary","byte_elem.GetType()",
             local_d8 + 1,local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  rhs = cfd::core::ScriptElement::GetOpCode((ScriptElement *)local_70);
  testing::internal::EqHelper<false>::Compare<cfd::core::ScriptOperator,cfd::core::ScriptOperator>
            ((EqHelper<false> *)local_f8,"ScriptOperator::OP_INVALIDOPCODE","byte_elem.GetOpCode()",
             (ScriptOperator *)cfd::core::ScriptOperator::OP_INVALIDOPCODE,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"1234567890abcdef",&local_169);
  cfd::core::ByteData::ByteData(&local_148,&local_168);
  cfd::core::ByteData::GetBytes(&local_130,&local_148);
  cfd::core::ScriptElement::GetBinaryData(&local_1a0,(ScriptElement *)local_70);
  cfd::core::ByteData::GetBytes(&local_188,&local_1a0);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_118,"ByteData(\"1234567890abcdef\").GetBytes()",
             "byte_elem.GetBinaryData().GetBytes()",&local_130,&local_188);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
  cfd::core::ByteData::~ByteData(&local_1a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130);
  cfd::core::ByteData::~ByteData(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_1c4 = 0;
  local_1d0 = cfd::core::ScriptElement::GetNumber((ScriptElement *)local_70);
  pcVar2 = (char *)0x0;
  testing::internal::EqHelper<true>::Compare<int,long>
            (local_1c0,"0",(int *)"byte_elem.GetNumber()",(long *)&local_1c4,&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"081234567890abcdef",&local_241);
  cfd::core::ByteData::ByteData(&local_220,&local_240);
  cfd::core::ByteData::GetBytes(&local_208,&local_220);
  cfd::core::ScriptElement::GetData(&local_278,(ScriptElement *)local_70);
  cfd::core::ByteData::GetBytes(&local_260,&local_278);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_1f0,"ByteData(\"081234567890abcdef\").GetBytes()",
             "byte_elem.GetData().GetBytes()",&local_208,&local_260);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_260);
  cfd::core::ByteData::~ByteData(&local_278);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208);
  cfd::core::ByteData::~ByteData(&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  cfd::core::ScriptElement::ToString_abi_cxx11_(&local_2b8,(ScriptElement *)local_70);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_298,"\"1234567890abcdef\"","byte_elem.ToString().c_str()",
             "1234567890abcdef",pcVar3);
  std::__cxx11::string::~string((string *)&local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2d9 = cfd::core::ScriptElement::IsBinary((ScriptElement *)local_70);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_2d8,
               (AssertionResult *)"byte_elem.IsBinary()","false","true",pcVar2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  bVar1 = cfd::core::ScriptElement::IsNumber((ScriptElement *)local_70);
  local_321 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_320,&local_321,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_320,
               (AssertionResult *)"byte_elem.IsNumber()","true","false",pcVar2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=(&local_338,&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  bVar1 = cfd::core::ScriptElement::IsOpCode((ScriptElement *)local_70);
  local_369 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_368,&local_369,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a0,(internal *)local_368,(AssertionResult *)"byte_elem.IsOpCode()","true",
               "false",pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  cfd::core::ScriptElement::~ScriptElement((ScriptElement *)local_70);
  return;
}

Assistant:

TEST(ScriptElement, ByteTypeConstructor) {
  ScriptElement byte_elem = ScriptElement(ByteData("1234567890abcdef"));

  EXPECT_EQ(ScriptElementType::kElementBinary, byte_elem.GetType());
  EXPECT_EQ(ScriptOperator::OP_INVALIDOPCODE, byte_elem.GetOpCode());
  EXPECT_EQ(ByteData("1234567890abcdef").GetBytes(),
            byte_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(0, byte_elem.GetNumber());
  EXPECT_EQ(ByteData("081234567890abcdef").GetBytes(),
            byte_elem.GetData().GetBytes());
  EXPECT_STREQ("1234567890abcdef", byte_elem.ToString().c_str());
  EXPECT_TRUE(byte_elem.IsBinary());
  EXPECT_FALSE(byte_elem.IsNumber());
  EXPECT_FALSE(byte_elem.IsOpCode());
}